

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_ptr.hpp
# Opt level: O2

shared_ptr<boost::xpressive::detail::regex_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
* __thiscall
boost::
shared_ptr<boost::xpressive::detail::regex_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
::operator=(shared_ptr<boost::xpressive::detail::regex_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *this,shared_ptr<boost::xpressive::detail::regex_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *r)

{
  element_type *peVar1;
  sp_counted_base *psVar2;
  regex_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__tmp;
  shared_count sStack_10;
  
  peVar1 = r->px;
  psVar2 = (r->pn).pi_;
  if (psVar2 != (sp_counted_base *)0x0) {
    LOCK();
    psVar2->use_count_ = psVar2->use_count_ + 1;
    UNLOCK();
  }
  sStack_10.pi_ = (this->pn).pi_;
  this->px = peVar1;
  (this->pn).pi_ = psVar2;
  detail::shared_count::~shared_count(&sStack_10);
  return this;
}

Assistant:

shared_ptr & operator=( shared_ptr const & r ) BOOST_SP_NOEXCEPT
    {
        this_type(r).swap(*this);
        return *this;
    }